

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Any.hpp
# Opt level: O1

void __thiscall
rc::detail::Any::
AnyImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~AnyImpl
          (AnyImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_IAnyImpl)._vptr_IAnyImpl = (_func_int **)&PTR_get_001b30d8;
  pcVar1 = (this->m_value)._M_dataplus._M_p;
  paVar2 = &(this->m_value).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

AnyImpl(ValueT &&value)
      : m_value(std::forward<ValueT>(value)) {}